

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O2

PipelineRegressor * __thiscall CoreML::Specification::Model::mutable_pipelineregressor(Model *this)

{
  PipelineRegressor *this_00;
  
  if (this->_oneof_case_[0] == 0xc9) {
    this_00 = (PipelineRegressor *)(this->Type_).pipelineclassifier_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 0xc9;
    this_00 = (PipelineRegressor *)operator_new(0x20);
    PipelineRegressor::PipelineRegressor(this_00);
    (this->Type_).pipelineregressor_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::PipelineRegressor* Model::mutable_pipelineregressor() {
  if (!has_pipelineregressor()) {
    clear_Type();
    set_has_pipelineregressor();
    Type_.pipelineregressor_ = new ::CoreML::Specification::PipelineRegressor;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.pipelineRegressor)
  return Type_.pipelineregressor_;
}